

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

int __thiscall Sudoku::rKrok(Sudoku *this,int index)

{
  bool bVar1;
  int iVar2;
  undefined1 local_208 [8];
  Sudoku novy;
  int i;
  int cisla [9];
  int local_1c;
  int vysledek;
  int index_local;
  Sudoku *this_local;
  
  memcpy(&novy.s.rozbite,&DAT_0010a3c0,0x24);
  iVar2 = jednoducheReseni(this);
  local_1c = index;
  if (iVar2 == 0) {
    while (((uint)(this->s).pole[local_1c] & 0xf) != 0) {
      local_1c = local_1c + 1;
    }
    std::random_shuffle<int*>((int *)&novy.s.rozbite,cisla + 7);
    for (novy.s.doplnenych = 0; (int)novy.s.doplnenych < 9;
        novy.s.doplnenych = novy.s.doplnenych + 1) {
      Sudoku((Sudoku *)local_208,this);
      iVar2 = doplnK((Sudoku *)local_208,local_1c % 9,local_1c / 9,
                     *(uint *)((long)(novy.s.ctverce + 3) + ((long)(int)novy.s.doplnenych + 2) * 4))
      ;
      if ((iVar2 == 0) || (iVar2 = rKrok((Sudoku *)local_208,local_1c + 1), iVar2 == 0)) {
        bVar1 = false;
      }
      else {
        memcpy(this,local_208,0x1bc);
        this_local._4_4_ = 1;
        bVar1 = true;
      }
      ~Sudoku((Sudoku *)local_208);
      if (bVar1) {
        return this_local._4_4_;
      }
    }
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Sudoku::rKrok (int index)
{
  int vysledek;
  int cisla[] = {1, 2, 3, 4, 5, 6, 7, 8, 9}; // seznam cisel na vyzkouseni
  // funguje to tak, ze si udelame tento seznam a ten pak pokazde nahodne prehazime
  // pro nedostatecne specifikovane sudoku (majici vice reseni) to znamena, ze reseni jsou nahodna

  // projdeme doplnovaci metodu, pokud to jde, vratime kladny vysledek
  // tato motoda diky tomu jak je postavena odchyti nektere kriticke stavy jako pokusy o pristup mimo pridelenou pamet apod.
  if (jednoducheReseni()) // povedlo se...
  {
    return true;
  }
  // nepovedlo se :/
  // zkusime to nasilnejsi metodou... hadanim :)
  else // budeme pokracovat v rekurzi
  {
    while (s.pole[index].zapsane) index++; // hledame dalsi prazdne policko
    random_shuffle(cisla, cisla + 9);// prehazime seznam cisel k vyzkoseni - soucast <algorithm>
    for (int i = 0; i< 9;i++)// vyzkousime vsechny mozna cisla v seznamu
    {
      Sudoku novy(this); // zkopirujeme si stavajici sudoku
      
      if(novy.doplnK(index%9,index/9,cisla[i])) // zkusime cislo doplnit
      {
        // slo to
        if(novy.rKrok(index+1)) // prokud se podari doplnit i dalsi pozici, je vse OK
        {
          s = novy.s; // okopirujeme stav noveho sudoku do puvodniho (tohoto)
          return true; // vse OK
        }
      }
    }
  }
  return false; // rekurze nad neplatnym sudoku vede k chybam...
}